

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.c
# Opt level: O3

int sx_ini_property_count(sx_ini *ini,int section)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  if ((ini != (sx_ini *)0x0) && (iVar1 = 0, 0 < (long)ini->property_count)) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(*(int *)(ini->properties->name + lVar2 + -4) == section);
      lVar2 = lVar2 + 0x78;
    } while ((long)ini->property_count * 0x78 - lVar2 != 0);
  }
  return iVar1;
}

Assistant:

int sx_ini_property_count(sx_ini const* ini, int section)
{
    return ini_property_count(ini, section);
}